

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode UA_Client_connect(UA_Client *client,char *endpointUrl)

{
  char *pcVar1;
  UA_String UVar2;
  size_t local_d8;
  UA_Byte *local_d0;
  undefined1 local_b0 [140];
  UA_StatusCode local_24;
  char *pcStack_20;
  UA_StatusCode retval;
  char *endpointUrl_local;
  UA_Client *client_local;
  
  if (client->state == UA_CLIENTSTATE_CONNECTED) {
    client_local._4_4_ = 0;
  }
  else {
    pcStack_20 = endpointUrl;
    endpointUrl_local = (char *)client;
    if (client->state == UA_CLIENTSTATE_ERRORED) {
      UA_Client_reset(client);
    }
    local_24 = 0;
    pcVar1 = endpointUrl_local + 0x38;
    (**(code **)(endpointUrl_local + 0x30))
              (local_b0,pcStack_20,*(undefined8 *)(endpointUrl_local + 0x10));
    memcpy(pcVar1,local_b0,0x88);
    pcVar1 = endpointUrl_local;
    if (*(int *)(endpointUrl_local + 0x38) == 0) {
      UVar2 = UA_String_fromChars(pcStack_20);
      local_d8 = UVar2.length;
      *(size_t *)(pcVar1 + 0xc0) = local_d8;
      local_d0 = UVar2.data;
      *(UA_Byte **)(pcVar1 + 200) = local_d0;
      if (*(long *)(endpointUrl_local + 200) == 0) {
        local_24 = 0x80030000;
      }
      else {
        *(undefined8 *)(endpointUrl_local + 0x3c) = *(undefined8 *)(endpointUrl_local + 0x18);
        *(undefined8 *)(endpointUrl_local + 0x44) = *(undefined8 *)(endpointUrl_local + 0x20);
        *(undefined4 *)(endpointUrl_local + 0x4c) = *(undefined4 *)(endpointUrl_local + 0x28);
        local_24 = HelAckHandshake((UA_Client *)endpointUrl_local);
        if (local_24 == 0) {
          local_24 = SecureChannelHandshake((UA_Client *)endpointUrl_local,false);
        }
        if (local_24 == 0) {
          local_24 = EndpointsHandshake((UA_Client *)endpointUrl_local);
        }
        if (local_24 == 0) {
          local_24 = SessionHandshake((UA_Client *)endpointUrl_local);
        }
        if (local_24 == 0) {
          local_24 = ActivateSession((UA_Client *)endpointUrl_local);
        }
        if (local_24 == 0) {
          endpointUrl_local[0x38] = '\x01';
          endpointUrl_local[0x39] = '\0';
          endpointUrl_local[0x3a] = '\0';
          endpointUrl_local[0x3b] = '\0';
          endpointUrl_local[0] = '\x01';
          endpointUrl_local[1] = '\0';
          endpointUrl_local[2] = '\0';
          endpointUrl_local[3] = '\0';
          return 0;
        }
      }
    }
    else {
      local_24 = 0x80ae0000;
    }
    UA_Client_reset((UA_Client *)endpointUrl_local);
    client_local._4_4_ = local_24;
  }
  return client_local._4_4_;
}

Assistant:

UA_StatusCode
UA_Client_connect(UA_Client *client, const char *endpointUrl) {
    if(client->state == UA_CLIENTSTATE_CONNECTED)
        return UA_STATUSCODE_GOOD;
    if(client->state == UA_CLIENTSTATE_ERRORED) {
        UA_Client_reset(client);
    }

    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    client->connection =
        client->config.connectionFunc(UA_ConnectionConfig_standard,
                                      endpointUrl, client->config.logger);
    if(client->connection.state != UA_CONNECTION_OPENING) {
        retval = UA_STATUSCODE_BADCONNECTIONCLOSED;
        goto cleanup;
    }

    client->endpointUrl = UA_STRING_ALLOC(endpointUrl);
    if(!client->endpointUrl.data) {
        retval = UA_STATUSCODE_BADOUTOFMEMORY;
        goto cleanup;
    }

    client->connection.localConf = client->config.localConnectionConfig;
    retval = HelAckHandshake(client);
    if(retval == UA_STATUSCODE_GOOD)
        retval = SecureChannelHandshake(client, false);
    if(retval == UA_STATUSCODE_GOOD)
        retval = EndpointsHandshake(client);
    if(retval == UA_STATUSCODE_GOOD)
        retval = SessionHandshake(client);
    if(retval == UA_STATUSCODE_GOOD)
        retval = ActivateSession(client);
    if(retval == UA_STATUSCODE_GOOD) {
        client->connection.state = UA_CONNECTION_ESTABLISHED;
        client->state = UA_CLIENTSTATE_CONNECTED;
    } else {
        goto cleanup;
    }
    return retval;

 cleanup:
    UA_Client_reset(client);
    return retval;
}